

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O0

void __thiscall
cinatra::coro_http_client::timer_guard::timer_guard
          (timer_guard *this,coro_http_client *self,duration duration,string *msg)

{
  element_type *peVar1;
  rep rVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  undefined8 in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  undefined8 *in_RDI;
  string *in_stack_00000148;
  period_timer *in_stack_00000150;
  coro_http_client *in_stack_00000158;
  duration in_stack_00000160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  type *in_stack_ffffffffffffffa8;
  LazyBase<bool,_false> *in_stack_ffffffffffffffb0;
  duration<long,_std::ratio<1L,_1000000000L>_> local_8;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  peVar1 = std::
           __shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cinatra::coro_http_client::socket_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x15dacd);
  peVar1->is_timeout_ = false;
  rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count(&local_8);
  if (-1 < rVar2) {
    std::__cxx11::string::string(in_stack_ffffffffffffffa0,in_RCX);
    timeout<coro_io::period_timer>
              (in_stack_00000158,in_stack_00000150,in_stack_00000160,in_stack_00000148);
    async_simple::coro::detail::LazyBase<bool,_false>::
    start<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_press_tool____include_cinatra_coro_http_client_hpp:633:20)>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    async_simple::coro::Lazy<bool>::~Lazy((Lazy<bool> *)0x15db59);
    std::__cxx11::string::~string(in_RSI);
  }
  return;
}

Assistant:

timer_guard(coro_http_client *self,
                std::chrono::steady_clock::duration duration, std::string msg)
        : self(self), dur_(duration) {
      self->socket_->is_timeout_ = false;

      if (duration.count() >= 0) {
        self->timeout(self->timer_, duration, std::move(msg))
            .start([](auto &&) {
            });
      }
      return;
    }